

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_DetermineFramesPerBuffer
                  (PaAlsaStreamComponent *self,PaStreamParameters *params,
                  unsigned_long framesPerUserBuffer,double sampleRate,snd_pcm_hw_params_t *hwParams,
                  int *accurate)

{
  int iVar1;
  int iVar2;
  pthread_t pVar3;
  snd_pcm_hw_params_t *in_RCX;
  unsigned_long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  double in_XMM0_Qa;
  int __pa_unsure_error_id_4;
  int __pa_unsure_error_id_3;
  int __pa_unsure_error_id_2;
  snd_pcm_uframes_t minmax_diff;
  snd_pcm_uframes_t max;
  snd_pcm_uframes_t min;
  int __pa_unsure_error_id_1;
  int __pa_unsure_error_id;
  uint minPeriods;
  uint maxPeriods;
  uint numPeriods;
  int dir;
  unsigned_long framesPerHostBuffer;
  unsigned_long bufferSize;
  PaError result;
  long in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  PaHostApiTypeId PVar4;
  ulong local_c8;
  ulong local_c0;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  ulong local_70;
  ulong local_68;
  int local_60;
  int local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  int local_4c;
  ulong local_48;
  unsigned_long local_40;
  PaError local_34;
  undefined4 *local_30;
  snd_pcm_hw_params_t *local_28;
  unsigned_long local_18;
  long local_8;
  
  PVar4 = (PaHostApiTypeId)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  local_34 = 0;
  local_4c = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_40 = PaAlsa_GetFramesPerHostBuffer(in_RDX,*(PaTime *)(in_RSI + 0x10),in_XMM0_Qa);
  local_50 = numPeriods_;
  local_54 = 0;
  local_58 = numPeriods_;
  local_4c = 0;
  local_5c = (*(code *)alsa_snd_pcm_hw_params_get_periods_min)(local_28,&local_58,&local_4c);
  if (local_5c < 0) {
    pVar3 = pthread_self();
    iVar1 = pthread_equal(pVar3,paUnixMainThread);
    if (iVar1 != 0) {
      (*alsa_snd_strerror)(local_5c);
      PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffff28,(char *)0x11b606);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_hw_params_get_periods_min( hwParams, &minPeriods, &dir )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2326\n"
                     );
    local_34 = -9999;
  }
  else {
    local_60 = (*(code *)alsa_snd_pcm_hw_params_get_periods_max)(local_28,&local_54,&local_4c);
    if (local_60 < 0) {
      pVar3 = pthread_self();
      iVar1 = pthread_equal(pVar3,paUnixMainThread);
      if (iVar1 != 0) {
        (*alsa_snd_strerror)(local_60);
        PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffff28,(char *)0x11b6a5);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_hw_params_get_periods_max( hwParams, &maxPeriods, &dir )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2327\n"
                       );
      local_34 = -9999;
    }
    else {
      if (local_50 < local_58) {
        local_a0 = local_58;
      }
      else {
        local_a0 = local_50;
      }
      if (local_54 < local_a0) {
        local_a4 = local_54;
      }
      else {
        if (local_50 < local_58) {
          local_a8 = local_58;
        }
        else {
          local_a8 = local_50;
        }
        local_a4 = local_a8;
      }
      local_50 = local_a4;
      local_48 = local_40 / local_a4;
      if (local_18 != 0) {
        local_48 = PaAlsa_AlignForward(local_48,local_18);
        if (local_48 < local_18) {
          iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                            (*(undefined8 *)(local_8 + 0x38),local_28,local_48,0);
          if (iVar1 < 0) {
            iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                              (*(undefined8 *)(local_8 + 0x38),local_28,local_48 << 1,0);
            if (iVar1 == 0) {
              local_48 = local_48 << 1;
            }
            else {
              iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                                (*(undefined8 *)(local_8 + 0x38),local_28,local_48 >> 1,0);
              if (iVar1 == 0) {
                local_48 = local_48 >> 1;
              }
            }
          }
        }
        else {
          iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                            (*(undefined8 *)(local_8 + 0x38),local_28,local_48,0);
          if (iVar1 < 0) {
            iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                              (*(undefined8 *)(local_8 + 0x38),local_28,local_48 + local_18,0);
            if (iVar1 == 0) {
              local_48 = local_18 + local_48;
            }
            else {
              iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                                (*(undefined8 *)(local_8 + 0x38),local_28,local_48 - local_18,0);
              if (iVar1 == 0) {
                local_48 = local_48 - local_18;
              }
            }
          }
        }
      }
      local_68 = 0;
      local_70 = 0;
      iVar1 = (*(code *)alsa_snd_pcm_hw_params_get_period_size_min)(local_28,&local_68,0);
      if (iVar1 < 0) {
        pVar3 = pthread_self();
        iVar2 = pthread_equal(pVar3,paUnixMainThread);
        if (iVar2 != 0) {
          (*alsa_snd_strerror)(iVar1);
          PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffff28,(char *)0x11b9c6);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_hw_params_get_period_size_min( hwParams, &min, NULL )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2441\n"
                         );
        local_34 = -9999;
      }
      else {
        iVar1 = (*(code *)alsa_snd_pcm_hw_params_get_period_size_max)(local_28,&local_70,0);
        if (iVar1 < 0) {
          pVar3 = pthread_self();
          iVar2 = pthread_equal(pVar3,paUnixMainThread);
          if (iVar2 != 0) {
            (*alsa_snd_strerror)(iVar1);
            PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffff28,(char *)0x11ba5e);
          }
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_pcm_hw_params_get_period_size_max( hwParams, &max, NULL )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2442\n"
                           );
          local_34 = -9999;
        }
        else {
          if (local_48 < local_68) {
            if (local_70 - local_68 == 2) {
              local_c0 = local_68 + 1;
            }
            else {
              local_c0 = local_68;
            }
            local_48 = local_c0;
          }
          else if (local_70 < local_48) {
            if (local_70 - local_68 == 2) {
              local_c8 = local_70 - 1;
            }
            else {
              local_c8 = local_70;
            }
            local_48 = local_c8;
          }
          local_4c = 0;
          iVar1 = (*alsa_snd_pcm_hw_params_set_period_size_near)
                            (*(snd_pcm_t **)(local_8 + 0x38),local_28,&local_48,&local_4c);
          if (iVar1 < 0) {
            pVar3 = pthread_self();
            iVar2 = pthread_equal(pVar3,paUnixMainThread);
            if (iVar2 != 0) {
              PVar4 = iVar1 >> 0x1f;
              (*alsa_snd_strerror)(iVar1);
              PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffff28,(char *)0x11bba1);
            }
            PaUtil_DebugPrint(
                             "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( self->pcm, hwParams, &framesPerHostBuffer, &dir )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2463\n"
                             );
            local_34 = -9999;
          }
          else {
            if (local_4c != 0) {
              *local_30 = 0;
            }
            *(ulong *)(local_8 + 0x40) = local_48;
          }
        }
      }
    }
  }
  return local_34;
}

Assistant:

static PaError PaAlsaStreamComponent_DetermineFramesPerBuffer( PaAlsaStreamComponent* self, const PaStreamParameters* params,
        unsigned long framesPerUserBuffer, double sampleRate, snd_pcm_hw_params_t* hwParams, int* accurate )
{
    PaError result = paNoError;
    unsigned long bufferSize, framesPerHostBuffer;
    int dir = 0;

    /* Calculate host buffer size */
    bufferSize = PaAlsa_GetFramesPerHostBuffer(framesPerUserBuffer, params->suggestedLatency, sampleRate);

    /* Log */
    PA_DEBUG(( "%s: user-buffer (frames)           = %lu\n", __FUNCTION__, framesPerUserBuffer ));
    PA_DEBUG(( "%s: user-buffer (sec)              = %f\n",  __FUNCTION__, (double)(framesPerUserBuffer / sampleRate) ));
    PA_DEBUG(( "%s: suggested latency (sec)        = %f\n",  __FUNCTION__, params->suggestedLatency ));
    PA_DEBUG(( "%s: suggested host buffer (frames) = %lu\n", __FUNCTION__, bufferSize ));
    PA_DEBUG(( "%s: suggested host buffer (sec)    = %f\n",  __FUNCTION__, (double)(bufferSize / sampleRate) ));

#ifdef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

    if( framesPerUserBuffer != paFramesPerBufferUnspecified )
    {
        /* Preferably the host buffer size should be a multiple of the user buffer size */

        if( bufferSize > framesPerUserBuffer )
        {
            snd_pcm_uframes_t remainder = bufferSize % framesPerUserBuffer;
            if( remainder > framesPerUserBuffer / 2. )
                bufferSize += framesPerUserBuffer - remainder;
            else
                bufferSize -= remainder;

            assert( bufferSize % framesPerUserBuffer == 0 );
        }
        else if( framesPerUserBuffer % bufferSize != 0 )
        {
            /*  Find a good compromise between user specified latency and buffer size */
            if( bufferSize > framesPerUserBuffer * .75 )
            {
                bufferSize = framesPerUserBuffer;
            }
            else
            {
                snd_pcm_uframes_t newSz = framesPerUserBuffer;
                while( newSz / 2 >= bufferSize )
                {
                    if( framesPerUserBuffer % (newSz / 2) != 0 )
                    {
                        /* No use dividing any further */
                        break;
                    }
                    newSz /= 2;
                }
                bufferSize = newSz;
            }

            assert( framesPerUserBuffer % bufferSize == 0 );
        }
    }

#endif

    {
        unsigned numPeriods = numPeriods_, maxPeriods = 0, minPeriods = numPeriods_;

        /* It may be that the device only supports 2 periods for instance */
        dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_get_periods_min( hwParams, &minPeriods, &dir ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_hw_params_get_periods_max( hwParams, &maxPeriods, &dir ), paUnanticipatedHostError );
        assert( maxPeriods > 1 );

        /* Clamp to min/max */
        numPeriods = PA_MIN(maxPeriods, PA_MAX(minPeriods, numPeriods));

        PA_DEBUG(( "%s: periods min = %lu, max = %lu, req = %lu \n", __FUNCTION__, minPeriods, maxPeriods, numPeriods ));

#ifndef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

        /* Calculate period size */
        framesPerHostBuffer = (bufferSize / numPeriods);

        /* Align & test size */
        if( framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* Align to user buffer size */
            framesPerHostBuffer = PaAlsa_AlignForward(framesPerHostBuffer, framesPerUserBuffer);

            /* Test (borrowed from older implementation) */
            if( framesPerHostBuffer < framesPerUserBuffer )
            {
                assert( framesPerUserBuffer % framesPerHostBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer * 2, 0 ) == 0 )
                        framesPerHostBuffer *= 2;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer / 2, 0 ) == 0 )
                        framesPerHostBuffer /= 2;
                }
            }
            else
            {
                assert( framesPerHostBuffer % framesPerUserBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer + framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer += framesPerUserBuffer;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer - framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer -= framesPerUserBuffer;
                }
            }
        }
#endif

#ifdef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

        if( framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* Try to get a power-of-two of the user buffer size. */
            framesPerHostBuffer = framesPerUserBuffer;
            if( framesPerHostBuffer < bufferSize )
            {
                while( bufferSize / framesPerHostBuffer > numPeriods )
                {
                    framesPerHostBuffer *= 2;
                }
                /* One extra period is preferrable to one less (should be more robust) */
                if( bufferSize / framesPerHostBuffer < numPeriods )
                {
                    framesPerHostBuffer /= 2;
                }
            }
            else
            {
                while( bufferSize / framesPerHostBuffer < numPeriods )
                {
                    if( framesPerUserBuffer % ( framesPerHostBuffer / 2 ) != 0 )
                    {
                        /* Can't be divided any further */
                        break;
                    }
                    framesPerHostBuffer /= 2;
                }
            }

            if( framesPerHostBuffer < framesPerUserBuffer )
            {
                assert( framesPerUserBuffer % framesPerHostBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer * 2, 0 ) == 0 )
                        framesPerHostBuffer *= 2;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer / 2, 0 ) == 0 )
                        framesPerHostBuffer /= 2;
                }
            }
            else
            {
                assert( framesPerHostBuffer % framesPerUserBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer + framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer += framesPerUserBuffer;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer - framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer -= framesPerUserBuffer;
                }
            }
        }
        else
        {
            framesPerHostBuffer = bufferSize / numPeriods;
        }

        /* non-mmap mode needs a reasonably-sized buffer or it'll stutter */
        if( !self->canMmap && framesPerHostBuffer < 2048 )
            framesPerHostBuffer = 2048;
#endif
        PA_DEBUG(( "%s: suggested host buffer period   = %lu \n", __FUNCTION__, framesPerHostBuffer ));
    }

    {
        /* Get min/max period sizes and adjust our chosen */
        snd_pcm_uframes_t min = 0, max = 0, minmax_diff;
        ENSURE_( alsa_snd_pcm_hw_params_get_period_size_min( hwParams, &min, NULL ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_hw_params_get_period_size_max( hwParams, &max, NULL ), paUnanticipatedHostError );
        minmax_diff = max - min;

        if( framesPerHostBuffer < min )
        {
            PA_DEBUG(( "%s: The determined period size (%lu) is less than minimum (%lu)\n", __FUNCTION__, framesPerHostBuffer, min ));
            framesPerHostBuffer = (( minmax_diff == 2 ) ? min + 1 : min );
        }
        else if( framesPerHostBuffer > max )
        {
            PA_DEBUG(( "%s: The determined period size (%lu) is greater than maximum (%lu)\n", __FUNCTION__, framesPerHostBuffer, max ));
            framesPerHostBuffer = (( minmax_diff == 2 ) ? max - 1 : max );
        }

        PA_DEBUG(( "%s: device period minimum          = %lu\n", __FUNCTION__, min ));
        PA_DEBUG(( "%s: device period maximum          = %lu\n", __FUNCTION__, max ));
        PA_DEBUG(( "%s: host buffer period             = %lu\n", __FUNCTION__, framesPerHostBuffer ));
        PA_DEBUG(( "%s: host buffer period latency     = %f\n", __FUNCTION__, (double)( framesPerHostBuffer / sampleRate ) ));

        /* Try setting period size */
        dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( self->pcm, hwParams, &framesPerHostBuffer, &dir ), paUnanticipatedHostError );
        if( dir != 0 )
        {
            PA_DEBUG(( "%s: The configured period size is non-integer.\n", __FUNCTION__, dir ));
            *accurate = 0;
        }
    }

    /* Set result */
    self->framesPerPeriod = framesPerHostBuffer;

error:
    return result;
}